

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::FastV32S1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ParseContext *pPVar1;
  MessageLite *pMVar2;
  uint64_t uVar3;
  TcParseTableBase *this;
  uchar uVar4;
  int8_t iVar5;
  byte bVar6;
  bool bVar7;
  uint16_t uVar8;
  unsigned_short uVar9;
  uint uVar10;
  char *pcVar11;
  uint *puVar12;
  ulong uVar13;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_220;
  ulong local_218;
  int64_t res;
  uint64_t local_208;
  TcParseTableBase *local_200;
  ParseContext *local_1f8;
  char *local_1f0;
  MessageLite *local_1e8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_1e0;
  TcFieldData local_1d8;
  TcFieldData local_1d0;
  undefined1 local_1c1;
  ulong uStack_1c0;
  bool always_return;
  TcParseTableBase *local_1b8;
  ParseContext *local_1b0;
  char *local_1a8;
  MessageLite *local_1a0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_198;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_190;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_188;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  uint32_t has_bits_offset;
  ulong local_e8;
  int64_t res3;
  int64_t res2;
  anon_class_8_1_54a39810 last;
  anon_class_8_1_54a39810 next;
  bool kIs32BitVarint;
  bool kIs64BitVarint;
  char *local_b8;
  char *local_b0;
  int64_t *local_a8;
  int8_t local_91;
  ulong *local_90;
  int8_t local_79;
  int64_t *local_78;
  int8_t local_61;
  ulong *local_60;
  int8_t local_49;
  int8_t local_39;
  int8_t local_29;
  int8_t local_19;
  int8_t local_9;
  
  local_208 = hasbits;
  local_200 = table;
  local_1f8 = ctx;
  local_1f0 = ptr;
  local_1e8 = msg;
  local_1e0 = data.field_0;
  uVar4 = TcFieldData::coded_tag<unsigned_char>((TcFieldData *)&local_1e0);
  pMVar2 = local_1e8;
  pcVar11 = local_1f0;
  pPVar1 = local_1f8;
  if (uVar4 != '\0') {
    TcFieldData::TcFieldData((TcFieldData *)&res);
    pcVar11 = MiniParse(pMVar2,pcVar11,pPVar1,(TcFieldData)res,local_200,local_208);
    return pcVar11;
  }
  local_b8 = local_1f0 + 1;
  last.p = &local_b8;
  res2 = (int64_t)&local_b8;
  iVar5 = ShiftMixParseVarint<unsigned_int,_10>::anon_class_8_1_54a39810::operator()(&last);
  local_218 = (ulong)iVar5;
  if (iVar5 < '\0') {
    local_91 = ShiftMixParseVarint<unsigned_int,_10>::anon_class_8_1_54a39810::operator()(&last);
    local_a8 = &res3;
    res3 = (long)local_91 << 7 | local_218 >> 0x39;
    local_39 = local_91;
    if (res3 < 0) {
      local_79 = ShiftMixParseVarint<unsigned_int,_10>::anon_class_8_1_54a39810::operator()(&last);
      local_90 = &local_e8;
      local_e8 = (long)local_79 << 0xe | local_218 >> 0x32;
      local_29 = local_79;
      if ((long)local_e8 < 0) {
        local_61 = ShiftMixParseVarint<unsigned_int,_10>::anon_class_8_1_54a39810::operator()(&last)
        ;
        local_78 = &res3;
        res3 = ((long)local_61 << 0x15 | local_218 >> 0x2b) & res3;
        local_19 = local_61;
        if (res3 < 0) {
          local_49 = ShiftMixParseVarint<unsigned_int,_10>::anon_class_8_1_54a39810::operator()
                               (&last);
          local_60 = &local_e8;
          local_e8 = ((long)local_49 << 0x1c | local_218 >> 0x24) & local_e8;
          local_9 = local_49;
          if (((((long)local_e8 < 0) &&
               (iVar5 = ShiftMixParseVarint<unsigned_int,_10>::anon_class_8_1_54a39810::operator()
                                  (&last), ((int)iVar5 & 0x80U) != 0)) &&
              (iVar5 = ShiftMixParseVarint<unsigned_int,_10>::anon_class_8_1_54a39810::operator()
                                 (&last), ((int)iVar5 & 0x80U) != 0)) &&
             (((iVar5 = ShiftMixParseVarint<unsigned_int,_10>::anon_class_8_1_54a39810::operator()
                                  (&last), ((int)iVar5 & 0x80U) != 0 &&
               (iVar5 = ShiftMixParseVarint<unsigned_int,_10>::anon_class_8_1_54a39810::operator()
                                  (&last), ((int)iVar5 & 0x80U) != 0)) &&
              ((iVar5 = ShiftMixParseVarint<unsigned_int,_10>::anon_class_8_1_54a39810::operator()
                                  (&last), iVar5 != '\x01' &&
               (iVar5 = ShiftMixParseVarint<unsigned_int,_10>::anon_class_8_1_54a39810::operator()
                                  ((anon_class_8_1_54a39810 *)&res2), ((int)iVar5 & 0x80U) != 0)))))
             ) {
            local_b0 = (char *)0x0;
            goto LAB_004c55cc;
          }
        }
      }
      res3 = local_e8 & res3;
    }
    local_218 = res3 & local_218;
    if (local_b8 == (char *)0x0) {
      protobuf_assumption_failed
                ("p != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/varint_shuffle.h"
                 ,0x91);
    }
    local_b0 = local_b8;
  }
  else {
    local_b0 = local_b8;
  }
LAB_004c55cc:
  pMVar2 = local_1e8;
  pPVar1 = local_1f8;
  local_1f0 = local_b0;
  if (local_b0 == (char *)0x0) {
    TcFieldData::TcFieldData((TcFieldData *)&local_220);
    pcVar11 = Error(pMVar2,(char *)0x0,pPVar1,(TcFieldData)local_220,local_200,local_208);
    return pcVar11;
  }
  bVar6 = TcFieldData::hasbit_idx((TcFieldData *)&local_1e0);
  pMVar2 = local_1e8;
  local_208 = 1L << (bVar6 & 0x3f) | local_208;
  uVar8 = TcFieldData::offset((TcFieldData *)&local_1e0);
  puVar12 = RefAt<unsigned_int>(pMVar2,(ulong)uVar8);
  pMVar2 = local_1e8;
  pcVar11 = local_1f0;
  pPVar1 = local_1f8;
  *puVar12 = (uint)local_218;
  TcFieldData::TcFieldData(&data_local);
  local_198 = data_local.field_0;
  local_1a0 = pMVar2;
  local_1a8 = pcVar11;
  local_1b0 = pPVar1;
  local_1b8 = local_200;
  uStack_1c0 = local_208;
  local_1c1 = 0;
  bVar7 = EpsCopyInputStream::DataAvailable(&pPVar1->super_EpsCopyInputStream,pcVar11);
  pMVar2 = local_1a0;
  pcVar11 = local_1a8;
  pPVar1 = local_1b0;
  if (bVar7) {
    TcFieldData::TcFieldData(&local_1d8);
    this = local_1b8;
    uVar3 = uStack_1c0;
    uVar9 = UnalignedLoad<unsigned_short>(pcVar11);
    uVar13 = (ulong)(int)((uint)uVar9 & (uint)this->fast_idx_mask);
    if ((uVar13 & 7) == 0) {
      data_1.field_0 =
           (anon_union_8_1_898a9ca8_for_TcFieldData_0)TcParseTableBase::fast_entry(this,uVar13 >> 3)
      ;
      local_188.data =
           ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
           (ulong)uVar9;
      UNRECOVERED_JUMPTABLE =
           TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0);
      local_190.data = local_188.data;
      pcVar11 = (*UNRECOVERED_JUMPTABLE)(pMVar2,pcVar11,pPVar1,(TcFieldData)local_188,this,uVar3);
      return pcVar11;
    }
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  TcFieldData::TcFieldData(&local_1d0);
  if (local_1b8->has_bits_offset != 0) {
    uVar10 = (uint)uStack_1c0;
    puVar12 = RefAt<unsigned_int>(pMVar2,(ulong)(uint)local_1b8->has_bits_offset);
    *puVar12 = uVar10 | *puVar12;
  }
  return pcVar11;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastV32S1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return FastVarintS1<uint32_t>(PROTOBUF_TC_PARAM_PASS);
}